

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getCols(Highs *this,HighsInt num_set_entries,HighsInt *set,HighsInt *num_col,double *costs,
              double *lower,double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,
              double *value)

{
  HighsInt create_error;
  HighsStatus HVar1;
  allocator local_109;
  double *local_108;
  string local_100;
  HighsIndexCollection index_collection;
  HighsLogOptions local_90;
  
  if (num_set_entries == 0) {
    *num_col = 0;
    *num_nz = 0;
    HVar1 = kOk;
  }
  else {
    index_collection.dimension_ = -1;
    index_collection.is_interval_ = false;
    index_collection.from_ = -1;
    index_collection.to_ = -2;
    index_collection.is_set_ = false;
    index_collection.set_num_entries_ = -1;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    index_collection._41_8_ = 0;
    local_108 = lower;
    create_error = create(&index_collection,num_set_entries,set,(this->model_).lp_.num_col_);
    if (create_error == 0) {
      HVar1 = kOk;
      getColsInterface(this,&index_collection,num_col,costs,local_108,upper,num_nz,start,index,value
                      );
    }
    else {
      HighsLogOptions::HighsLogOptions
                (&local_90,&(this->options_).super_HighsOptionsStruct.log_options);
      std::__cxx11::string::string((string *)&local_100,"getCols",&local_109);
      analyseSetCreateError
                (&local_90,&local_100,create_error,false,num_set_entries,set,
                 (this->model_).lp_.num_col_);
      std::__cxx11::string::~string((string *)&local_100);
      std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
      HVar1 = kError;
    }
    HighsIndexCollection::~HighsIndexCollection(&index_collection);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::getCols(const HighsInt num_set_entries, const HighsInt* set,
                           HighsInt& num_col, double* costs, double* lower,
                           double* upper, HighsInt& num_nz, HighsInt* start,
                           HighsInt* index, double* value) const {
  if (num_set_entries == 0) {
    // Empty interval
    num_col = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "getCols", create_error,
                                 false, num_set_entries, set,
                                 model_.lp_.num_col_);
  getColsInterface(index_collection, num_col, costs, lower, upper, num_nz,
                   start, index, value);
  return HighsStatus::kOk;
}